

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_eff(void)

{
  blow_effect *pbVar1;
  blow_effect *next;
  blow_effect *eff;
  
  next = blow_effects;
  while (next != (blow_effect *)0x0) {
    pbVar1 = next->next;
    string_free(next->effect_type);
    string_free(next->desc);
    string_free(next->name);
    next = pbVar1;
  }
  mem_free(blow_effects);
  return;
}

Assistant:

static void cleanup_eff(void)
{
	struct blow_effect *eff = blow_effects;
	struct blow_effect *next;

	while (eff) {
		next = eff->next;
		string_free(eff->effect_type);
		string_free(eff->desc);
		string_free(eff->name);
		eff = next;
	}
	mem_free(blow_effects);
}